

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O0

base_uint<256U> * __thiscall base_uint<256U>::operator<<=(base_uint<256U> *this,uint shift)

{
  sbyte sVar1;
  uint uVar2;
  int iVar3;
  uint in_ESI;
  base_uint<256U> *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int k;
  int i;
  base_uint<256U> a;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  uint local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  base_uint((base_uint<256U> *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),
            (base_uint<256U> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (iVar4 = 0; iVar4 < 8; iVar4 = iVar4 + 1) {
    in_RDI->pn[iVar4] = 0;
  }
  uVar2 = in_ESI >> 5;
  for (iVar4 = 0; iVar4 < 8; iVar4 = iVar4 + 1) {
    sVar1 = (sbyte)(in_ESI & 0x1f);
    if (((int)(iVar4 + uVar2 + 1) < 8) && ((in_ESI & 0x1f) != 0)) {
      iVar3 = iVar4 + uVar2 + 1;
      in_RDI->pn[iVar3] = local_28[iVar4] >> (0x20U - sVar1 & 0x1f) | in_RDI->pn[iVar3];
    }
    if ((int)(iVar4 + uVar2) < 8) {
      in_RDI->pn[(int)(iVar4 + uVar2)] = local_28[iVar4] << sVar1 | in_RDI->pn[(int)(iVar4 + uVar2)]
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

base_uint<BITS>& base_uint<BITS>::operator<<=(unsigned int shift)
{
    base_uint<BITS> a(*this);
    for (int i = 0; i < WIDTH; i++)
        pn[i] = 0;
    int k = shift / 32;
    shift = shift % 32;
    for (int i = 0; i < WIDTH; i++) {
        if (i + k + 1 < WIDTH && shift != 0)
            pn[i + k + 1] |= (a.pn[i] >> (32 - shift));
        if (i + k < WIDTH)
            pn[i + k] |= (a.pn[i] << shift);
    }
    return *this;
}